

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterFederate.cpp
# Opt level: O2

pair<helics::ActionMessage_&,_bool> __thiscall
helics::FilterFederate::executeFilter(FilterFederate *this,ActionMessage *command,FilterInfo *filt)

{
  int iVar1;
  element_type *peVar2;
  Message *pMVar3;
  pointer puVar4;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar5;
  Message *pMVar6;
  pair<helics::ActionMessage_&,_bool> pVar7;
  vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  new_messages;
  ActionMessage cmd;
  vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  local_120;
  _Head_base<0UL,_helics::Message_*,_false> local_108;
  __uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_> local_100;
  _Head_base<0UL,_helics::Message_*,_false> local_f8;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> local_f0;
  ActionMessage local_e8;
  
  (this->mCoord).triggered = true;
  iVar1 = (filt->core_id).gid;
  if (iVar1 == (this->mFedID).gid) {
    if (filt->cloning == false) {
      createMessageFromCommand((helics *)&local_120,command);
      local_100._M_t.
      super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
      super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl =
           (tuple<helics::Message_*,_std::default_delete<helics::Message>_>)
           (tuple<helics::Message_*,_std::default_delete<helics::Message>_>)
           local_120.
           super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_120.
      super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (*((filt->filterOp).super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->_vptr_FilterOperator[2])(&local_e8);
      uVar5 = local_e8._0_8_;
      local_e8._0_8_ = (__uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>)0x0;
      std::__uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>::reset
                ((__uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_> *)
                 &local_120,(pointer)uVar5);
      std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)&local_e8);
      std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)&local_100);
      puVar4 = local_120.
               super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((Message *)
          local_120.
          super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start == (Message *)0x0) {
        ActionMessage::ActionMessage(&local_e8,cmd_ignore);
        ActionMessage::operator=(command,&local_e8);
        ActionMessage::~ActionMessage(&local_e8);
      }
      else {
        local_108._M_head_impl =
             (Message *)
             local_120.
             super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_120.
        super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        ActionMessage::ActionMessage
                  (&local_e8,
                   (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)&local_108)
        ;
        ActionMessage::operator=(command,&local_e8);
        ActionMessage::~ActionMessage(&local_e8);
        std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                  ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)&local_108)
        ;
      }
      std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)&local_120);
      uVar5 = extraout_RDX_01;
      if ((Message *)puVar4 == (Message *)0x0) goto LAB_002aadc2;
    }
    else {
      peVar2 = (filt->filterOp).
               super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      createMessageFromCommand((helics *)&local_f0,command);
      (*peVar2->_vptr_FilterOperator[3])(&local_120,peVar2,(helics *)&local_f0);
      std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                (&local_f0);
      for (pMVar6 = (Message *)
                    local_120.
                    super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pMVar6 != (Message *)
                    local_120.
                    super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pMVar6 = (Message *)&pMVar6->flags)
      {
        pMVar3 = (((__uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_> *)
                  &(pMVar6->time).internalTimeCode)->_M_t).
                 super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
                 super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
        if (pMVar3 != (Message *)0x0) {
          (((__uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_> *)
           &(pMVar6->time).internalTimeCode)->_M_t).
          super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
          super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl = (Message *)0x0;
          local_f8._M_head_impl = pMVar3;
          ActionMessage::ActionMessage
                    (&local_e8,
                     (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)&local_f8
                    );
          std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                    ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)&local_f8
                    );
          std::function<void_(helics::ActionMessage_&)>::operator()
                    (&this->mDeliverMessage,&local_e8);
          ActionMessage::~ActionMessage(&local_e8);
        }
      }
      std::
      vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
      ::~vector(&local_120);
      uVar5 = extraout_RDX_00;
    }
  }
  else {
    if (filt->cloning == false) {
      (command->dest_id).gid = iVar1;
      (command->dest_handle).hid = (filt->handle).hid;
LAB_002aadc2:
      uVar5 = 0;
      goto LAB_002aadc4;
    }
    ActionMessage::ActionMessage(&local_e8,command);
    ActionMessage::setAction(&local_e8,cmd_send_for_filter);
    local_e8.flags._1_1_ = local_e8.flags._1_1_ | 2;
    local_e8.dest_id.gid = (filt->core_id).gid;
    local_e8.dest_handle.hid = (filt->handle).hid;
    std::function<void_(const_helics::ActionMessage_&)>::operator()(&this->mSendMessage,&local_e8);
    ActionMessage::~ActionMessage(&local_e8);
    uVar5 = extraout_RDX;
  }
  uVar5 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
LAB_002aadc4:
  pVar7._8_8_ = uVar5;
  pVar7.first = command;
  return pVar7;
}

Assistant:

std::pair<ActionMessage&, bool> FilterFederate::executeFilter(ActionMessage& command,
                                                              FilterInfo* filt)
{
    mCoord.triggered = true;
    if (filt->core_id == mFedID) {
        if (filt->cloning) {
            // cloning filter returns a vector
            auto new_messages = filt->filterOp->processVector(createMessageFromCommand(command));
            for (auto& msg : new_messages) {
                if (msg) {
                    ActionMessage cmd(std::move(msg));
                    mDeliverMessage(cmd);
                }
            }
        } else {
            // deal with local source filters
            auto tempMessage = createMessageFromCommand(std::move(command));
            tempMessage = filt->filterOp->process(std::move(tempMessage));
            if (tempMessage) {
                command = ActionMessage(std::move(tempMessage));
            } else {
                // the filter dropped the message;
                command = CMD_IGNORE;
                return {command, false};
            }
        }
    } else if (filt->cloning) {
        ActionMessage cloneMessage(command);
        cloneMessage.setAction(CMD_SEND_FOR_FILTER);
        setActionFlag(cloneMessage, clone_flag);
        cloneMessage.dest_id = filt->core_id;
        cloneMessage.dest_handle = filt->handle;
        mSendMessage(cloneMessage);
    } else {
        command.dest_id = filt->core_id;
        command.dest_handle = filt->handle;

        return {command, false};
    }
    return {command, true};
}